

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8 * google::protobuf::io::CodedOutputStream::WriteVarint32FallbackToArray
                  (uint32 value,uint8 *target)

{
  long lVar1;
  byte bVar2;
  
  *target = (byte)value | 0x80;
  if (value < 0x80) {
    *target = (byte)value;
    lVar1 = 1;
  }
  else {
    bVar2 = (byte)(value >> 7);
    target[1] = bVar2 | 0x80;
    if (value < 0x4000) {
      target[1] = bVar2;
      lVar1 = 2;
    }
    else {
      bVar2 = (byte)(value >> 0xe);
      target[2] = bVar2 | 0x80;
      if (value < 0x200000) {
        target[2] = bVar2;
        lVar1 = 3;
      }
      else {
        bVar2 = (byte)(value >> 0x15);
        target[3] = bVar2 | 0x80;
        if (value < 0x10000000) {
          target[3] = bVar2;
          lVar1 = 4;
        }
        else {
          target[4] = (byte)(value >> 0x1c);
          lVar1 = 5;
        }
      }
    }
  }
  return target + lVar1;
}

Assistant:

uint8* CodedOutputStream::WriteVarint32FallbackToArray(
    uint32 value, uint8* target) {
  return WriteVarint32FallbackToArrayInline(value, target);
}